

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

TxMempoolInfo * __thiscall
CTxMemPool::info_for_relay(CTxMemPool *this,GenTxid *gtxid,uint64_t last_sequence)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  const_iterator it;
  uint64_t uVar4;
  ulong in_RCX;
  TxMempoolInfo *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock12;
  CTxMemPoolEntry *in_stack_ffffffffffffff38;
  hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
  *in_stack_ffffffffffffff40;
  hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
  *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  uint256 *in_stack_ffffffffffffff58;
  CTxMemPool *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff70;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff38);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (char *)in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff58 >> 0x18,0));
  bVar2 = GenTxid::IsWtxid((GenTxid *)in_stack_ffffffffffffff38);
  if (bVar2) {
    GenTxid::GetHash((GenTxid *)in_stack_ffffffffffffff38);
    get_iter_from_wtxid(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    GenTxid::GetHash((GenTxid *)in_stack_ffffffffffffff38);
    boost::multi_index::detail::
    hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
    ::find<uint256>(in_stack_ffffffffffffff40,(uint256 *)in_stack_ffffffffffffff38);
  }
  it = boost::multi_index::detail::
       hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
       ::end((hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
              *)CONCAT17(in_stack_ffffffffffffff57,
                         CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
  bVar3 = boost::operators_impl::operator!=
                    (in_stack_ffffffffffffff48,
                     (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                      *)in_stack_ffffffffffffff40);
  bVar2 = false;
  if (bVar3) {
    boost::operators_impl::
    dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
    ::operator->((dereferenceable<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_const_CTxMemPoolEntry_*,_boost::operators_impl::iterator_helper<std::forward_iterator_tag,_CTxMemPoolEntry,_long,_const_CTxMemPoolEntry_*,_const_CTxMemPoolEntry_&>_>
                  *)in_stack_ffffffffffffff38);
    uVar4 = CTxMemPoolEntry::GetSequence(in_stack_ffffffffffffff38);
    bVar2 = uVar4 < in_RCX;
  }
  if (bVar2) {
    GetInfo((const_iterator)it.node);
  }
  else {
    memset(in_RDI,0,0x30);
    TxMempoolInfo::TxMempoolInfo((TxMempoolInfo *)in_stack_ffffffffffffff38);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

TxMempoolInfo CTxMemPool::info_for_relay(const GenTxid& gtxid, uint64_t last_sequence) const
{
    LOCK(cs);
    indexed_transaction_set::const_iterator i = (gtxid.IsWtxid() ? get_iter_from_wtxid(gtxid.GetHash()) : mapTx.find(gtxid.GetHash()));
    if (i != mapTx.end() && i->GetSequence() < last_sequence) {
        return GetInfo(i);
    } else {
        return TxMempoolInfo();
    }
}